

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

void __thiscall SQNativeClosure::Mark(SQNativeClosure *this,SQCollectable **chain)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    if (this->_noutervalues != 0) {
      lVar2 = 0;
      uVar1 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar2),
                   (SQCollectable_conflict **)chain);
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar1 < this->_noutervalues);
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQNativeClosure::Mark(SQCollectable **chain)
{
    START_MARK()
        for(SQUnsignedInteger i = 0; i < _noutervalues; i++) SQSharedState::MarkObject(_outervalues[i], chain);
    END_MARK()
}